

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

Scal __thiscall LinearExpert::queryXafterZ(LinearExpert *this,X *x)

{
  X *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  Index index;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Index othersize;
  ActualDstType actualDst;
  Scalar SVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  X xInvVar;
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> local_99;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  Scal local_88;
  undefined8 uStack_80;
  double local_78;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_70;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  this_00 = &this->dx;
  pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar5 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  lVar9 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if ((this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar9) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar9,1);
  }
  pdVar6 = (this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar8 = (this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  uVar7 = uVar8 - ((long)uVar8 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar8) {
    lVar9 = 0;
    do {
      pdVar1 = pdVar4 + lVar9;
      dVar13 = pdVar1[1];
      pdVar2 = pdVar5 + lVar9;
      dVar11 = pdVar2[1];
      pdVar3 = pdVar6 + lVar9;
      *pdVar3 = *pdVar1 - *pdVar2;
      pdVar3[1] = dVar13 - dVar11;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar7);
  }
  if ((long)uVar7 < (long)uVar8) {
    do {
      pdVar6[uVar7] = pdVar4[uVar7] - pdVar5[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  local_88 = this->gamma;
  uStack_80 = 0;
  uVar8 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,uVar8,1);
  pdVar4 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (local_98.m_storage.m_rows != uVar8) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,uVar8,1);
  }
  dVar13 = local_88 + 1.0;
  uVar8 = local_98.m_storage.m_rows - (local_98.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_98.m_storage.m_rows) {
    lVar9 = 0;
    do {
      auVar12._8_8_ = dVar13;
      auVar12._0_8_ = dVar13;
      auVar12 = divpd(*(undefined1 (*) [16])(pdVar4 + lVar9),auVar12);
      *(undefined1 (*) [16])(local_98.m_storage.m_data + lVar9) = auVar12;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < local_98.m_storage.m_rows) {
    do {
      local_98.m_storage.m_data[uVar8] = pdVar4[uVar8] / dVar13;
      uVar8 = uVar8 + 1;
    } while (local_98.m_storage.m_rows != uVar8);
  }
  local_70.m_lhs.m_xpr = this_00;
  local_70.m_rhs = (RhsNested)&local_98;
  if (local_98.m_storage.m_rows == 0) {
    dVar13 = -0.0;
  }
  else {
    local_48.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_48.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_98.m_storage.m_data;
    SVar10 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       (&local_48,&local_99,&local_70);
    dVar13 = SVar10 * -0.5;
  }
  local_88 = exp(dVar13);
  this->rbf_x = local_88;
  this->rbf_zx = this->rbf_z * local_88;
  dVar13 = this->p_z_T;
  if (local_98.m_storage.m_rows == 0) {
    dVar11 = 1.0;
  }
  else {
    local_70._0_8_ = local_98.m_storage.m_data;
    local_78 = dVar13;
    dVar11 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_70,
                        (scalar_product_op<double,_double> *)&local_48,
                        (Matrix<double,__1,_1,_0,__1,_1> *)&local_98);
    dVar13 = local_78;
  }
  local_88 = local_88 * dVar13;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  local_88 = local_88 * dVar11;
  this->p_zx = local_88;
  free(local_98.m_storage.m_data);
  return local_88;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryXafterZ( X const &x )
{
    dx = x - pred_x;

    X xInvVar = invPsi / (1.0 + gamma);

    rbf_x = exp(-0.5*dx.cwiseAbs2().dot(xInvVar));
    rbf_zx = rbf_z * rbf_x;
    p_zx = p_z_T * rbf_x * sqrt(xInvVar.prod());

    return p_zx;
}